

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unames.cpp
# Opt level: O0

UBool icu_63::enumNames(UCharNames *names,UChar32 start,UChar32 limit,UEnumCharNamesFn *fn,
                       void *context,UCharNameChoice nameChoice)

{
  bool bVar1;
  UBool UVar2;
  ushort uVar3;
  uint uVar4;
  uint16_t *group_00;
  ushort *puVar5;
  int local_7c;
  UChar32 next;
  UChar32 end_1;
  uint16_t *nextGroup_1;
  UChar32 end;
  uint16_t *nextGroup;
  uint16_t *groups;
  UChar32 extLimit;
  uint16_t *groupLimit;
  uint16_t *group;
  uint16_t groupCount;
  uint16_t endGroupMSB;
  uint16_t startGroupMSB;
  UCharNameChoice nameChoice_local;
  void *context_local;
  UEnumCharNamesFn *fn_local;
  UChar32 limit_local;
  UChar32 start_local;
  UCharNames *names_local;
  
  uVar4 = start >> 5;
  uVar3 = (ushort)(limit + -1 >> 5);
  group_00 = getGroup(names,start);
  fn_local._4_4_ = start;
  if (((uVar4 & 0xffff) < (uint)*group_00) && (nameChoice == U_EXTENDED_CHAR_NAME)) {
    groups._4_4_ = (uint)*group_00 << 5;
    if (limit < (int)groups._4_4_) {
      groups._4_4_ = limit;
    }
    UVar2 = enumExtNames(start,groups._4_4_ - 1,fn,context);
    if (UVar2 == '\0') {
      return '\0';
    }
    fn_local._4_4_ = groups._4_4_;
  }
  if ((ushort)uVar4 == uVar3) {
    if ((uVar4 & 0xffff) == (uint)*group_00) {
      names_local._7_1_ =
           enumGroupNames(names,group_00,fn_local._4_4_,limit + -1,fn,context,nameChoice);
    }
    else {
LAB_0021cda3:
      if (nameChoice == U_EXTENDED_CHAR_NAME) {
        fn_local._0_4_ = limit;
        if (0x110000 < limit) {
          fn_local._0_4_ = 0x110000;
        }
        names_local._7_1_ = enumExtNames(fn_local._4_4_,(UChar32)fn_local + -1,fn,context);
      }
      else {
        names_local._7_1_ = '\x01';
      }
    }
  }
  else {
    puVar5 = (ushort *)((long)&names->tokenStringOffset + (ulong)names->groupsOffset);
    puVar5 = puVar5 + (long)(int)((uint)*puVar5 * 3) + 1;
    if ((uVar4 & 0xffff) == (uint)*group_00) {
      if ((fn_local._4_4_ & 0x1f) != 0) {
        UVar2 = enumGroupNames(names,group_00,fn_local._4_4_,(uVar4 & 0xffff) * 0x20 + 0x1f,fn,
                               context,nameChoice);
        if (UVar2 == '\0') {
          return '\0';
        }
        group_00 = group_00 + 3;
      }
    }
    else if (((((uint)*group_00 < (uVar4 & 0xffff)) && (group_00 = group_00 + 3, group_00 < puVar5))
             && ((ushort)uVar4 < *group_00)) && (nameChoice == U_EXTENDED_CHAR_NAME)) {
      nextGroup_1._4_4_ = (uint)*group_00 << 5;
      if (limit < nextGroup_1._4_4_) {
        nextGroup_1._4_4_ = limit;
      }
      UVar2 = enumExtNames(fn_local._4_4_,nextGroup_1._4_4_ + -1,fn,context);
      if (UVar2 == '\0') {
        return '\0';
      }
    }
    do {
      do {
        groupLimit = group_00;
        bVar1 = false;
        if (groupLimit < puVar5) {
          bVar1 = *groupLimit < uVar3;
        }
        if (!bVar1) {
          if ((groupLimit < puVar5) && (*groupLimit == uVar3)) {
            UVar2 = enumGroupNames(names,groupLimit,limit - 1U & 0xffffffe0,limit + -1,fn,context,
                                   nameChoice);
            return UVar2;
          }
          if ((nameChoice != U_EXTENDED_CHAR_NAME) || (groupLimit != puVar5)) {
            return '\x01';
          }
          uVar4 = (groupLimit[-3] + 1) * 0x20;
          if ((int)fn_local._4_4_ < (int)uVar4) {
            fn_local._4_4_ = uVar4;
          }
          goto LAB_0021cda3;
        }
        fn_local._4_4_ = (uint)*groupLimit * 0x20;
        UVar2 = enumGroupNames(names,groupLimit,fn_local._4_4_,fn_local._4_4_ + 0x1f,fn,context,
                               nameChoice);
        if (UVar2 == '\0') {
          return '\0';
        }
        group_00 = groupLimit + 3;
      } while (((puVar5 <= group_00) || ((uint)*group_00 <= *groupLimit + 1)) ||
              (nameChoice != U_EXTENDED_CHAR_NAME));
      local_7c = (uint)*group_00 << 5;
      if (limit < local_7c) {
        local_7c = limit;
      }
      UVar2 = enumExtNames((*groupLimit + 1) * 0x20,local_7c + -1,fn,context);
    } while (UVar2 != '\0');
    names_local._7_1_ = '\0';
  }
  return names_local._7_1_;
}

Assistant:

static UBool
enumNames(UCharNames *names,
          UChar32 start, UChar32 limit,
          UEnumCharNamesFn *fn, void *context,
          UCharNameChoice nameChoice) {
    uint16_t startGroupMSB, endGroupMSB, groupCount;
    const uint16_t *group, *groupLimit;

    startGroupMSB=(uint16_t)(start>>GROUP_SHIFT);
    endGroupMSB=(uint16_t)((limit-1)>>GROUP_SHIFT);

    /* find the group that contains start, or the highest before it */
    group=getGroup(names, start);

    if(startGroupMSB<group[GROUP_MSB] && nameChoice==U_EXTENDED_CHAR_NAME) {
        /* enumerate synthetic names between start and the group start */
        UChar32 extLimit=((UChar32)group[GROUP_MSB]<<GROUP_SHIFT);
        if(extLimit>limit) {
            extLimit=limit;
        }
        if(!enumExtNames(start, extLimit-1, fn, context)) {
            return FALSE;
        }
        start=extLimit;
    }

    if(startGroupMSB==endGroupMSB) {
        if(startGroupMSB==group[GROUP_MSB]) {
            /* if start and limit-1 are in the same group, then enumerate only in that one */
            return enumGroupNames(names, group, start, limit-1, fn, context, nameChoice);
        }
    } else {
        const uint16_t *groups=GET_GROUPS(names);
        groupCount=*groups++;
        groupLimit=groups+groupCount*GROUP_LENGTH;

        if(startGroupMSB==group[GROUP_MSB]) {
            /* enumerate characters in the partial start group */
            if((start&GROUP_MASK)!=0) {
                if(!enumGroupNames(names, group,
                                   start, ((UChar32)startGroupMSB<<GROUP_SHIFT)+LINES_PER_GROUP-1,
                                   fn, context, nameChoice)) {
                    return FALSE;
                }
                group=NEXT_GROUP(group); /* continue with the next group */
            }
        } else if(startGroupMSB>group[GROUP_MSB]) {
            /* make sure that we start enumerating with the first group after start */
            const uint16_t *nextGroup=NEXT_GROUP(group);
            if (nextGroup < groupLimit && nextGroup[GROUP_MSB] > startGroupMSB && nameChoice == U_EXTENDED_CHAR_NAME) {
                UChar32 end = nextGroup[GROUP_MSB] << GROUP_SHIFT;
                if (end > limit) {
                    end = limit;
                }
                if (!enumExtNames(start, end - 1, fn, context)) {
                    return FALSE;
                }
            }
            group=nextGroup;
        }

        /* enumerate entire groups between the start- and end-groups */
        while(group<groupLimit && group[GROUP_MSB]<endGroupMSB) {
            const uint16_t *nextGroup;
            start=(UChar32)group[GROUP_MSB]<<GROUP_SHIFT;
            if(!enumGroupNames(names, group, start, start+LINES_PER_GROUP-1, fn, context, nameChoice)) {
                return FALSE;
            }
            nextGroup=NEXT_GROUP(group);
            if (nextGroup < groupLimit && nextGroup[GROUP_MSB] > group[GROUP_MSB] + 1 && nameChoice == U_EXTENDED_CHAR_NAME) {
                UChar32 end = nextGroup[GROUP_MSB] << GROUP_SHIFT;
                if (end > limit) {
                    end = limit;
                }
                if (!enumExtNames((group[GROUP_MSB] + 1) << GROUP_SHIFT, end - 1, fn, context)) {
                    return FALSE;
                }
            }
            group=nextGroup;
        }

        /* enumerate within the end group (group[GROUP_MSB]==endGroupMSB) */
        if(group<groupLimit && group[GROUP_MSB]==endGroupMSB) {
            return enumGroupNames(names, group, (limit-1)&~GROUP_MASK, limit-1, fn, context, nameChoice);
        } else if (nameChoice == U_EXTENDED_CHAR_NAME && group == groupLimit) {
            UChar32 next = (PREV_GROUP(group)[GROUP_MSB] + 1) << GROUP_SHIFT;
            if (next > start) {
                start = next;
            }
        } else {
            return TRUE;
        }
    }

    /* we have not found a group, which means everything is made of
       extended names. */
    if (nameChoice == U_EXTENDED_CHAR_NAME) {
        if (limit > UCHAR_MAX_VALUE + 1) {
            limit = UCHAR_MAX_VALUE + 1;
        }
        return enumExtNames(start, limit - 1, fn, context);
    }
    
    return TRUE;
}